

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

int __thiscall
libtorrent::torrent_handle::sync_call_ret<int,int(libtorrent::aux::torrent::*)()const>
          (torrent_handle *this,int def,offset_in_torrent_to_subr f)

{
  int iVar1;
  bool bVar2;
  element_type *this_00;
  session_impl *this_01;
  io_context *ctx;
  undefined8 uVar3;
  undefined1 local_c0 [8];
  type local_b8;
  exception_ptr local_78;
  exception_ptr ex;
  bool done;
  session_impl *ses;
  int local_4c;
  undefined1 local_48 [4];
  int r;
  shared_ptr<libtorrent::aux::torrent> t;
  offset_in_torrent_to_subr f_local;
  int def_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)f;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_48);
  local_4c = def;
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar2) {
    throw_invalid_handle();
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  this_01 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ex._M_exception_object._7_1_ = 0;
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78);
  ctx = libtorrent::aux::session_impl::get_context(this_01);
  local_b8.r = &local_4c;
  local_b8.done = (bool *)((long)&ex._M_exception_object + 7);
  local_b8.ex = &local_78;
  local_b8.ses = this_01;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            (&local_b8.t,(shared_ptr<libtorrent::aux::torrent> *)local_48);
  local_b8.f = (offset_in_torrent_to_subr)
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<int,int(libtorrent::aux::torrent::*)()const>(int,int(libtorrent::aux::torrent::*)()const)const::_lambda()_1_>
            (ctx,&local_b8,(type *)0x0);
  const::{lambda()#1}::~sync_call_ret((_lambda___1_ *)&local_b8);
  libtorrent::aux::torrent_wait((bool *)((long)&ex._M_exception_object + 7),this_01);
  bVar2 = ::std::__exception_ptr::exception_ptr::operator_cast_to_bool(&local_78);
  iVar1 = local_4c;
  if (!bVar2) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_48);
    return iVar1;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_c0,&local_78);
  uVar3 = ::std::rethrow_exception((exception_ptr)local_c0);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_48);
  _Unwind_Resume(uVar3);
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}